

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

int proxy_h2_on_header(nghttp2_session *session,nghttp2_frame *frame,uint8_t *name,size_t namelen,
                      uint8_t *value,size_t valuelen,uint8_t flags,void *userp)

{
  uint uVar1;
  long lVar2;
  CURLcode CVar3;
  char *fmt;
  int iVar4;
  Curl_easy *data;
  int http_status;
  size_t local_48;
  uint8_t *local_40;
  http_resp *resp;
  
  lVar2 = *(long *)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)(lVar2 + 8);
  }
  uVar1 = (frame->hd).stream_id;
  if (uVar1 == *(uint *)(lVar2 + 0x120)) {
    if ((frame->hd).type == '\x05') {
      return -0x386;
    }
    if ((*(byte *)(lVar2 + 0x134) & 1) == 0) {
      if ((namelen == 7) && (*(int *)(name + 3) == 0x73757461 && *(int *)name == 0x6174733a)) {
        CVar3 = Curl_http_decode_status(&http_status,(char *)value,valuelen);
        if (CVar3 != CURLE_OK) {
          return -0x386;
        }
        CVar3 = Curl_http_resp_make(&resp,http_status,(char *)0x0);
        if (CVar3 != CURLE_OK) {
          return -0x386;
        }
        resp->prev = *(http_resp **)(lVar2 + 0x90);
        *(http_resp **)(lVar2 + 0x90) = resp;
        if (((data != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
           ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) {
          if (*(int *)(*userp + 0xc) < 1) {
            return 0;
          }
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] status: HTTP/2 %03d",(ulong)uVar1,
                            (ulong)(uint)resp->status);
          return 0;
        }
      }
      else {
        if (*(long *)(lVar2 + 0x90) == 0) {
          return -0x386;
        }
        local_48 = valuelen;
        local_40 = value;
        CVar3 = Curl_dynhds_add((dynhds *)(*(long *)(lVar2 + 0x90) + 0x10),(char *)name,namelen,
                                (char *)value,valuelen);
        if (CVar3 != CURLE_OK) {
          return -0x386;
        }
        if (((data != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
           ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) {
          if (*(int *)(*userp + 0xc) < 1) {
            return 0;
          }
          fmt = "[%d] header: %.*s: %.*s";
          iVar4 = 0;
          valuelen = local_48;
          value = local_40;
          goto LAB_00622782;
        }
      }
    }
    iVar4 = 0;
  }
  else {
    iVar4 = -0x386;
    if (data == (Curl_easy *)0x0) {
      return -0x386;
    }
    if (userp == (void *)0x0) {
      return -0x386;
    }
    if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
      return -0x386;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return -0x386;
    }
    fmt = "[%d] header for non-tunnel stream: %.*s: %.*s";
LAB_00622782:
    Curl_trc_cf_infof(data,(Curl_cfilter *)userp,fmt,(ulong)uVar1,namelen & 0xffffffff,name,valuelen
                      ,value);
  }
  return iVar4;
}

Assistant:

static int proxy_h2_on_header(nghttp2_session *session,
                              const nghttp2_frame *frame,
                              const uint8_t *name, size_t namelen,
                              const uint8_t *value, size_t valuelen,
                              uint8_t flags,
                              void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;

  (void)flags;
  (void)data;
  (void)session;
  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */
  if(stream_id != ctx->tunnel.stream_id) {
    CURL_TRC_CF(data, cf, "[%d] header for non-tunnel stream: "
                "%.*s: %.*s", stream_id,
                (int)namelen, name, (int)valuelen, value);
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  if(frame->hd.type == NGHTTP2_PUSH_PROMISE)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  if(ctx->tunnel.has_final_response) {
    /* we do not do anything with trailers for tunnel streams */
    return 0;
  }

  if(namelen == sizeof(HTTP_PSEUDO_STATUS) - 1 &&
     memcmp(HTTP_PSEUDO_STATUS, name, namelen) == 0) {
    int http_status;
    struct http_resp *resp;

    /* status: always comes first, we might get more than one response,
     * link the previous ones for keepers */
    result = Curl_http_decode_status(&http_status,
                                    (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = Curl_http_resp_make(&resp, http_status, NULL);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    resp->prev = ctx->tunnel.resp;
    ctx->tunnel.resp = resp;
    CURL_TRC_CF(data, cf, "[%d] status: HTTP/2 %03d",
                stream_id, ctx->tunnel.resp->status);
    return 0;
  }

  if(!ctx->tunnel.resp)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  result = Curl_dynhds_add(&ctx->tunnel.resp->headers,
                           (const char *)name, namelen,
                           (const char *)value, valuelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  CURL_TRC_CF(data, cf, "[%d] header: %.*s: %.*s",
              stream_id, (int)namelen, name, (int)valuelen, value);

  return 0; /* 0 is successful */
}